

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O2

int c_vsnprintf(char *buf,size_t buf_size,char *fmt,__va_list_tag *ap)

{
  byte bVar1;
  char cVar2;
  int64_t num;
  byte bVar3;
  int iVar4;
  int *piVar5;
  uint *puVar6;
  byte *pbVar7;
  undefined8 *puVar8;
  char *pcVar9;
  ulong *puVar11;
  int64_t *piVar12;
  uint uVar13;
  long lVar14;
  ulong num_00;
  long lVar15;
  int iVar16;
  uint uVar17;
  int iVar18;
  byte *pbVar19;
  int iVar20;
  int iVar21;
  bool bVar22;
  size_t sVar10;
  
  iVar20 = (int)buf_size;
  iVar21 = 0;
  do {
    while( true ) {
      bVar1 = *fmt;
      lVar15 = (long)iVar21;
      if (bVar1 == 0x25) break;
      if (bVar1 == 0) {
        if (buf_size != 0) {
          iVar16 = iVar20 + -1;
          if (iVar21 < iVar20) {
            iVar16 = iVar21;
          }
          buf[iVar16] = '\0';
        }
        return iVar21;
      }
      if (iVar21 < iVar20) {
        buf[lVar15] = bVar1;
      }
      fmt = (char *)((byte *)fmt + 1);
LAB_001087b3:
      iVar21 = iVar21 + 1;
    }
    iVar16 = 0;
    bVar1 = ((byte *)fmt)[1];
    pbVar19 = (byte *)fmt + 2;
    bVar3 = bVar1;
    while ((byte)(bVar3 - 0x30) < 10) {
      iVar16 = (uint)(byte)(bVar3 - 0x30) + iVar16 * 10;
      bVar3 = *pbVar19;
      pbVar19 = pbVar19 + 1;
    }
    if (bVar3 == 0x2a) {
      uVar13 = ap->gp_offset;
      if ((ulong)uVar13 < 0x29) {
        piVar5 = (int *)((ulong)uVar13 + (long)ap->reg_save_area);
        ap->gp_offset = uVar13 + 8;
      }
      else {
        piVar5 = (int *)ap->overflow_arg_area;
        ap->overflow_arg_area = piVar5 + 2;
      }
      iVar16 = *piVar5;
      bVar3 = *pbVar19;
    }
    else {
      pbVar19 = pbVar19 + -1;
    }
    uVar13 = 0;
    if (bVar3 == 0x2e) {
      bVar3 = pbVar19[1];
      if (bVar3 == 0x2a) {
        uVar17 = ap->gp_offset;
        if ((ulong)uVar17 < 0x29) {
          puVar6 = (uint *)((ulong)uVar17 + (long)ap->reg_save_area);
          ap->gp_offset = uVar17 + 8;
        }
        else {
          puVar6 = (uint *)ap->overflow_arg_area;
          ap->overflow_arg_area = puVar6 + 2;
        }
        sVar10 = (size_t)*puVar6;
        bVar3 = pbVar19[2];
        pbVar19 = pbVar19 + 2;
      }
      else {
        sVar10 = 0;
        pbVar7 = pbVar19;
        while( true ) {
          pbVar19 = pbVar7 + 1;
          if (9 < (byte)(bVar3 - 0x30)) break;
          sVar10 = (size_t)((uint)(byte)(bVar3 - 0x30) + (int)sVar10 * 10);
          bVar3 = pbVar7[2];
          pbVar7 = pbVar19;
        }
      }
    }
    else {
      sVar10 = 0;
    }
    uVar17 = bVar3 - 0x49;
    if ((uVar17 < 0x32) && ((0x2090a80000009U >> ((ulong)uVar17 & 0x3f) & 1) != 0)) {
      bVar22 = pbVar19[1] == 0x68;
      uVar13 = (uint)bVar3;
      if (bVar22) {
        uVar13 = 0x48;
      }
      pbVar7 = pbVar19 + 1;
      if (bVar22) {
        pbVar7 = pbVar19 + 2;
      }
      bVar22 = pbVar19[(ulong)bVar22 + 1] == 0x6c;
      if (bVar22) {
        uVar13 = 0x71;
      }
      pbVar19 = pbVar7 + bVar22;
      bVar3 = pbVar7[bVar22];
    }
    fmt = (char *)(pbVar19 + 1);
    if (bVar3 == 99) {
      uVar13 = ap->gp_offset;
      if ((ulong)uVar13 < 0x29) {
        pcVar9 = (char *)((ulong)uVar13 + (long)ap->reg_save_area);
        ap->gp_offset = uVar13 + 8;
      }
      else {
        pcVar9 = (char *)ap->overflow_arg_area;
        ap->overflow_arg_area = pcVar9 + 8;
      }
      if (iVar21 < iVar20) {
        buf[iVar21] = *pcVar9;
      }
      goto LAB_001087b3;
    }
    if (bVar3 == 0x73) {
      uVar13 = ap->gp_offset;
      if ((ulong)uVar13 < 0x29) {
        puVar8 = (undefined8 *)((ulong)uVar13 + (long)ap->reg_save_area);
        ap->gp_offset = uVar13 + 8;
      }
      else {
        puVar8 = (undefined8 *)ap->overflow_arg_area;
        ap->overflow_arg_area = puVar8 + 1;
      }
      pcVar9 = (char *)*puVar8;
      iVar18 = (int)sVar10;
      if (iVar18 < 0) {
        iVar4 = 0;
      }
      else {
        sVar10 = strnlen(pcVar9,sVar10);
        iVar4 = (int)sVar10;
      }
      iVar16 = iVar16 - iVar4;
      if (iVar16 < 1) {
        iVar16 = 0;
      }
      while (bVar22 = iVar16 != 0, iVar16 = iVar16 + -1, bVar22) {
        if (lVar15 < iVar20) {
          buf[lVar15] = ' ';
        }
        lVar15 = lVar15 + 1;
        iVar21 = iVar21 + 1;
      }
      for (lVar14 = 0; (lVar14 < iVar18 || iVar18 < 1 && (cVar2 = pcVar9[lVar14], cVar2 != '\0'));
          lVar14 = lVar14 + 1) {
        if (lVar15 + lVar14 < (long)iVar20) {
          buf[lVar14 + lVar15] = cVar2;
        }
        iVar21 = iVar21 + 1;
      }
    }
    else {
      uVar17 = (uint)(bVar1 == 0x30);
      if ((bVar3 == 100) && (uVar13 == 0)) {
        uVar13 = ap->gp_offset;
        if ((ulong)uVar13 < 0x29) {
          piVar5 = (int *)((ulong)uVar13 + (long)ap->reg_save_area);
          ap->gp_offset = uVar13 + 8;
        }
        else {
          piVar5 = (int *)ap->overflow_arg_area;
          ap->overflow_arg_area = piVar5 + 2;
        }
        num_00 = (ulong)*piVar5;
LAB_00108a80:
        iVar18 = 10;
LAB_00108a83:
        iVar16 = c_itoa(buf + lVar15,buf_size - lVar15,num_00,iVar18,uVar17,iVar16);
        iVar21 = iVar21 + iVar16;
      }
      else {
        if (((bVar3 == 100) && (uVar13 == 0x6c)) || ((bVar3 == 100 && (uVar13 == 0x71)))) {
          uVar13 = ap->gp_offset;
          if ((ulong)uVar13 < 0x29) {
            puVar11 = (ulong *)((ulong)uVar13 + (long)ap->reg_save_area);
            ap->gp_offset = uVar13 + 8;
          }
          else {
            puVar11 = (ulong *)ap->overflow_arg_area;
            ap->overflow_arg_area = puVar11 + 1;
          }
          num_00 = *puVar11;
          goto LAB_00108a80;
        }
        if ((bVar3 == 0x75 || bVar3 == 0x78) && (uVar13 == 0)) {
          uVar13 = ap->gp_offset;
          if ((ulong)uVar13 < 0x29) {
            puVar6 = (uint *)((ulong)uVar13 + (long)ap->reg_save_area);
            ap->gp_offset = uVar13 + 8;
          }
          else {
            puVar6 = (uint *)ap->overflow_arg_area;
            ap->overflow_arg_area = puVar6 + 2;
          }
          num_00 = (ulong)*puVar6;
LAB_00108b4e:
          iVar18 = 10;
          if (bVar3 == 0x78) {
            iVar18 = 0x10;
          }
          goto LAB_00108a83;
        }
        if ((bVar3 == 0x75 || bVar3 == 0x78) && uVar13 == 0x6c) {
          uVar13 = ap->gp_offset;
          if ((ulong)uVar13 < 0x29) {
            puVar11 = (ulong *)((ulong)uVar13 + (long)ap->reg_save_area);
            ap->gp_offset = uVar13 + 8;
          }
          else {
            puVar11 = (ulong *)ap->overflow_arg_area;
            ap->overflow_arg_area = puVar11 + 1;
          }
          num_00 = *puVar11;
          goto LAB_00108b4e;
        }
        if (bVar3 != 0x70) {
          abort();
        }
        uVar13 = ap->gp_offset;
        if ((ulong)uVar13 < 0x29) {
          piVar12 = (int64_t *)((ulong)uVar13 + (long)ap->reg_save_area);
          ap->gp_offset = uVar13 + 8;
        }
        else {
          piVar12 = (int64_t *)ap->overflow_arg_area;
          ap->overflow_arg_area = piVar12 + 1;
        }
        num = *piVar12;
        if (iVar21 < iVar20) {
          buf[lVar15] = '0';
        }
        if ((int)(lVar15 + 1) < iVar20) {
          buf[lVar15 + 1] = 'x';
        }
        iVar16 = c_itoa(buf + lVar15 + 2,buf_size - (lVar15 + 2),num,0x10,uVar17,0);
        iVar21 = iVar21 + iVar16 + 2;
      }
    }
  } while( true );
}

Assistant:

int c_vsnprintf(char *buf, size_t buf_size, const char *fmt, va_list ap) {
    int ch, i = 0, len_mod, flags, precision, field_width;

    while ((ch = *fmt++) != '\0') {
        if (ch != '%') {
            C_SNPRINTF_APPEND_CHAR(ch);
        } else {
            /*
       * Conversion specification:
       *   zero or more flags (one of: # 0 - <space> + ')
       *   an optional minimum  field  width (digits)
       *   an  optional precision (. followed by digits, or *)
       *   an optional length modifier (one of: hh h l ll L q j z t)
       *   conversion specifier (one of: d i o u x X e E f F g G a A c s p n)
       */
            flags = field_width = precision = len_mod = 0;

            /* Flags. only zero-pad flag is supported. */
            if (*fmt == '0') {
                flags |= C_SNPRINTF_FLAG_ZERO;
            }

            /* Field width */
            while (*fmt >= '0' && *fmt <= '9') {
                field_width *= 10;
                field_width += *fmt++ - '0';
            }
            /* Dynamic field width */
            if (*fmt == '*') {
                field_width = va_arg(ap, int);
                fmt++;
            }

            /* Precision */
            if (*fmt == '.') {
                fmt++;
                if (*fmt == '*') {
                    precision = va_arg(ap, int);
                    fmt++;
                } else {
                    while (*fmt >= '0' && *fmt <= '9') {
                        precision *= 10;
                        precision += *fmt++ - '0';
                    }
                }
            }

            /* Length modifier */
            switch (*fmt) {
                case 'h':
                case 'l':
                case 'L':
                case 'I':
                case 'q':
                case 'j':
                case 'z':
                case 't':
                    len_mod = *fmt++;
                    if (*fmt == 'h') {
                        len_mod = 'H';
                        fmt++;
                    }
                    if (*fmt == 'l') {
                        len_mod = 'q';
                        fmt++;
                    }
                    break;
            }

            ch = *fmt++;
            if (ch == 's') {
                const char *s = va_arg(ap, const char *); /* Always fetch parameter */
                int j;
                int pad = field_width - (precision >= 0 ? strnlen(s, precision) : 0);
                for (j = 0; j < pad; j++) {
                    C_SNPRINTF_APPEND_CHAR(' ');
                }

                /* Ignore negative and 0 precisions */
                for (j = 0; (precision <= 0 || j < precision) && s[j] != '\0'; j++) {
                    C_SNPRINTF_APPEND_CHAR(s[j]);
                }
            } else if (ch == 'c') {
                ch = va_arg(ap, int); /* Always fetch parameter */
                C_SNPRINTF_APPEND_CHAR(ch);
            } else if (ch == 'd' && len_mod == 0) {
                i += c_itoa(buf + i, buf_size - i, va_arg(ap, int), 10, flags,
                            field_width);
            } else if (ch == 'd' && len_mod == 'l') {
                i += c_itoa(buf + i, buf_size - i, va_arg(ap, long), 10, flags,
                            field_width);
            } else if (ch == 'd' && len_mod == 'q') {
                i += c_itoa(buf + i, buf_size - i, va_arg(ap, int64_t), 10, flags,
                            field_width);
            } else if ((ch == 'x' || ch == 'u') && len_mod == 0) {
                i += c_itoa(buf + i, buf_size - i, va_arg(ap, unsigned),
                            ch == 'x' ? 16 : 10, flags, field_width);
            } else if ((ch == 'x' || ch == 'u') && len_mod == 'l') {
                i += c_itoa(buf + i, buf_size - i, va_arg(ap, unsigned long),
                            ch == 'x' ? 16 : 10, flags, field_width);
            } else if (ch == 'p') {
                unsigned long num = (unsigned long) va_arg(ap, void *);
                C_SNPRINTF_APPEND_CHAR('0');
                C_SNPRINTF_APPEND_CHAR('x');
                i += c_itoa(buf + i, buf_size - i, num, 16, flags, 0);
            } else {
#ifndef NO_LIBC
                /*
         * TODO(lsm): abort is not nice in a library, remove it
         * Also, ESP8266 SDK doesn't have it
         */
                abort();
#endif
            }
        }
    }

    /* Zero-terminate the result */
    if (buf_size > 0) {
        buf[i < (int) buf_size ? i : (int) buf_size - 1] = '\0';
    }

    return i;
}